

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdNameMap.h
# Opt level: O0

PropertyId __thiscall
Rml::IdNameMap<Rml::PropertyId>::GetOrCreateId(IdNameMap<Rml::PropertyId> *this,String *name)

{
  code *pcVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  pointer ppVar5;
  bool inserted;
  Iter<false> *it;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  pair;
  PropertyId next_id;
  String *name_local;
  IdNameMap<Rml::PropertyId> *this_local;
  
  sVar3 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  sVar4 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->reverse_map);
  if ((sVar3 != sVar4) &&
     (bVar2 = Assert("RMLUI_ASSERT(name_map.size() == reverse_map.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/IdNameMap.h"
                     ,0x57), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  sVar3 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  pair._23_1_ = SUB81(sVar3,0);
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,Rml::PropertyId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string_const&,Rml::PropertyId&>
            ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
              *)&it,(Table<true,80ul,std::__cxx11::string,Rml::PropertyId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                     *)&this->reverse_map,name,&pair.field_0x17);
  if (((byte)pair.first.mInfo & 1) != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,name);
  }
  ppVar5 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::Iter<false>::operator->((Iter<false> *)&it);
  return ppVar5->second;
}

Assistant:

ID GetOrCreateId(const String& name)
	{
		// All predefined properties must be set before possibly adding custom properties here
		RMLUI_ASSERT(name_map.size() == reverse_map.size());

		ID next_id = static_cast<ID>(name_map.size());

		// Only insert if not already in list
		auto pair = reverse_map.emplace(name, next_id);
		const auto& it = pair.first;
		bool inserted = pair.second;

		if (inserted)
			name_map.push_back(name);

		// Return the property id that already existed, or the new one if inserted
		return it->second;
	}